

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void CConsole::ConModCommandAccess(IResult *pResult,void *pUser)

{
  int iVar1;
  undefined4 extraout_var;
  CCommand *pCVar2;
  undefined8 uVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *format;
  char *pcVar4;
  long in_FS_OFFSET;
  char aBuf [128];
  char acStack_a8 [136];
  long local_20;
  undefined4 extraout_var_00;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
  pCVar2 = FindCommand((CConsole *)pUser,(char *)CONCAT44(extraout_var,iVar1),4);
  if (pCVar2 == (CCommand *)0x0) {
    iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
    str_format(acStack_a8,0x80,"No such command: \'%s\'.",CONCAT44(extraout_var_01,iVar1));
  }
  else {
    if (pResult->m_NumArgs == 2) {
      iVar1 = (*pResult->_vptr_IResult[2])(pResult,1);
      (pCVar2->super_CCommandInfo).m_AccessLevel = (uint)(0 < iVar1);
      iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
      uVar3 = CONCAT44(extraout_var_00,iVar1);
      pcVar4 = "enabled";
      if ((pCVar2->super_CCommandInfo).m_AccessLevel == 0) {
        pcVar4 = "disabled";
      }
      format = "moderator access for \'%s\' is now %s";
    }
    else {
      iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
      uVar3 = CONCAT44(extraout_var_02,iVar1);
      pcVar4 = "enabled";
      if ((pCVar2->super_CCommandInfo).m_AccessLevel == 0) {
        pcVar4 = "disabled";
      }
      format = "moderator access for \'%s\' is %s";
    }
    str_format(acStack_a8,0x80,format,uVar3,pcVar4);
  }
  (**(code **)(*pUser + 200))(pUser,0,"console",acStack_a8,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::ConModCommandAccess(IResult *pResult, void *pUser)
{
	CConsole* pConsole = static_cast<CConsole *>(pUser);
	char aBuf[128];
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), CFGFLAG_SERVER);
	if(pCommand)
	{
		if(pResult->NumArguments() == 2)
		{
			pCommand->SetAccessLevel(pResult->GetInteger(1));
			str_format(aBuf, sizeof(aBuf), "moderator access for '%s' is now %s", pResult->GetString(0), pCommand->GetAccessLevel() ? "enabled" : "disabled");
		}
		else
			str_format(aBuf, sizeof(aBuf), "moderator access for '%s' is %s", pResult->GetString(0), pCommand->GetAccessLevel() ? "enabled" : "disabled");
	}
	else
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));

	pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}